

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CompileMessageList.cpp
# Opt level: O2

void soul::throwInternalCompilerError(char *message,char *location,int line)

{
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,message,&local_f9);
  choc::text::addDoubleQuotes(&local_d8,&local_38);
  std::operator+(&local_b8,&local_d8," failed at ");
  std::operator+(&local_98,&local_b8,location);
  std::operator+(&local_78,&local_98,":");
  std::__cxx11::to_string(&local_f8,line);
  std::operator+(&local_58,&local_78,&local_f8);
  throwInternalCompilerError(&local_58);
}

Assistant:

[[noreturn]] void throwInternalCompilerError (const char* message, const char* location, int line)
{
    throwInternalCompilerError (choc::text::addDoubleQuotes (message) + " failed at " + location + ":" + std::to_string (line));
}